

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

string * __thiscall
upb::generator::FieldInitializer_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,FieldDefPtr field,
          upb_MiniTableField *field64,upb_MiniTableField *field32)

{
  uint32_t value;
  AlphaNum *a;
  string_view format;
  Arg *in_stack_fffffffffffffdb0;
  char *local_240;
  string local_220;
  Arg local_200;
  Arg local_1d0;
  byte local_199;
  AlphaNum local_198;
  string local_168;
  Arg local_148;
  string local_108;
  Arg local_e8;
  string local_b8;
  Arg local_98;
  Arg local_68;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  upb_MiniTableField *local_28;
  upb_MiniTableField *field32_local;
  upb_MiniTableField *field64_local;
  FieldDefPtr field_local;
  
  local_28 = field64;
  field32_local = (upb_MiniTableField *)field.ptr_;
  field64_local = (upb_MiniTableField *)this;
  field_local.ptr_ = (upb_FieldDef *)__return_storage_ptr__;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,"{$0, $1, $2, $3, $4, $5}");
  value = ::upb_MiniTableField_Number(field32_local);
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_68,value);
  ArchDependentSize_abi_cxx11_
            (&local_b8,(generator *)(ulong)local_28->offset_dont_copy_me__upb_internal_use_only,
             (ulong)field32_local->offset_dont_copy_me__upb_internal_use_only,(int64_t)field64);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_98,&local_b8);
  ArchDependentSize_abi_cxx11_
            (&local_108,(generator *)(long)local_28->presence,(long)field32_local->presence,
             (int64_t)field64);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_e8,&local_108);
  local_199 = 0;
  if (field32_local->submsg_index_dont_copy_me__upb_internal_use_only == 0xffff) {
    local_240 = "kUpb_NoSub";
  }
  else {
    absl::lts_20250127::AlphaNum::AlphaNum
              (&local_198,(uint)field32_local->submsg_index_dont_copy_me__upb_internal_use_only);
    absl::lts_20250127::StrCat_abi_cxx11_(&local_168,(lts_20250127 *)&local_198,a);
    local_199 = 1;
    local_240 = (char *)std::__cxx11::string::c_str();
  }
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_148,local_240);
  absl::lts_20250127::substitute_internal::Arg::Arg
            (&local_1d0,(uint)field32_local->descriptortype_dont_copy_me__upb_internal_use_only);
  GetModeInit_abi_cxx11_(&local_220,(generator *)local_28,field32_local,field64);
  absl::lts_20250127::substitute_internal::Arg::Arg<std::allocator<char>>(&local_200,&local_220);
  format._M_str = (char *)&local_68;
  format._M_len = (size_t)local_38._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)local_38._M_len,format,&local_98,&local_e8,
             &local_148,&local_1d0,&local_200,in_stack_fffffffffffffdb0);
  std::__cxx11::string::~string((string *)&local_220);
  if ((local_199 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_168);
  }
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string FieldInitializer(upb::FieldDefPtr field,
                             const upb_MiniTableField* field64,
                             const upb_MiniTableField* field32) {
  return absl::Substitute(
      "{$0, $1, $2, $3, $4, $5}", upb_MiniTableField_Number(field64),
      ArchDependentSize(field32->UPB_PRIVATE(offset),
                        field64->UPB_PRIVATE(offset)),
      ArchDependentSize(field32->presence, field64->presence),
      field64->UPB_PRIVATE(submsg_index) == kUpb_NoSub
          ? "kUpb_NoSub"
          : absl::StrCat(field64->UPB_PRIVATE(submsg_index)).c_str(),
      field64->UPB_PRIVATE(descriptortype), GetModeInit(field32, field64));
}